

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O1

bool P_CheckSwitchRange(AActor *user,line_t_conflict *line,int sideno,DVector3 *optpos)

{
  int iVar1;
  side_t *psVar2;
  extsector_t *peVar3;
  undefined8 *puVar4;
  double *pdVar5;
  F3DFloor *pFVar6;
  double dVar7;
  uint uVar8;
  AActor *pAVar9;
  bool bVar10;
  subsector_t *psVar11;
  FSwitchDef *pFVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  sector_t_conflict *psVar17;
  bool bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  DVector2 check;
  DVector3 pos;
  divline_t dll;
  double checkbot;
  double checktop;
  FLineOpening open;
  divline_t dlu;
  DVector2 local_148;
  DVector2 local_138;
  undefined8 local_128;
  divline_t local_120;
  sector_t_conflict *local_100;
  AActor *local_f8;
  double local_f0;
  double local_e8;
  FLineOpening local_e0;
  divline_t local_50;
  
  psVar2 = line->sidedef[sideno];
  if (psVar2 != (side_t *)0x0) {
    uVar8 = line->flags & 0xffdfffff;
    if (0 < psVar2->textures[1].texture.texnum) {
      uVar8 = line->flags;
    }
    if ((uVar8 & 0x600000) != 0) {
      local_100 = psVar2->sector;
      local_120.x = (line->v1->p).X;
      local_120.y = (line->v1->p).Y;
      local_120.dx = (line->delta).X;
      local_120.dy = (line->delta).Y;
      if (optpos == (DVector3 *)0x0) {
        dVar7 = (user->__Pos).Z;
        uVar19 = SUB84(dVar7,0);
        uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
        iVar14 = user->Sector->PortalGroup;
        iVar1 = line->frontsector->PortalGroup;
        local_138.X = 0.0;
        local_138.Y = 0.0;
        if (iVar14 != iVar1) {
          iVar14 = iVar1 * Displacements.size + iVar14;
          local_138.X = Displacements.data.Array[iVar14].pos.X;
          local_138.Y = Displacements.data.Array[iVar14].pos.Y;
        }
        local_138.Y = (user->__Pos).Y + local_138.Y;
        local_138.X = (user->__Pos).X + local_138.X;
      }
      else {
        local_138.X = optpos->X;
        local_138.Y = optpos->Y;
        uVar19 = SUB84(optpos->Z,0);
        uVar20 = (undefined4)((ulong)optpos->Z >> 0x20);
      }
      local_128 = CONCAT44(uVar20,uVar19);
      local_50.x = local_138.X;
      local_50.y = local_138.Y;
      local_50.dx = FFastTrig::cos(&fasttrig,
                                   (user->Angles).Yaw.Degrees * 11930464.711111112 +
                                   6755399441055744.0);
      local_f8 = user;
      local_50.dy = FFastTrig::sin(&fasttrig,
                                   (user->Angles).Yaw.Degrees * 11930464.711111112 +
                                   6755399441055744.0);
      dVar7 = P_InterceptVector(&local_120,&local_50);
      if ((line->sidedef[0]->Flags & 0x40) == 0) {
        local_148.X = local_120.x + local_120.dx * dVar7;
        local_148.Y = local_120.dy * dVar7 + local_120.y;
        psVar17 = local_100;
      }
      else {
        local_148.X = local_120.x + local_120.dx * (dVar7 + 0.01);
        local_148.Y = (dVar7 + 0.01) * local_120.dy + local_120.y;
        psVar11 = P_PointInSubsector(local_148.X,local_148.Y);
        psVar17 = psVar11->sector;
      }
      pAVar9 = local_f8;
      if (((line->sidedef[1] == (side_t *)0x0) || ((line->sidedef[0]->Flags & 0x40) != 0)) ||
         (P_LineOpening(&local_e0,(AActor *)0x0,(line_t *)line,&local_148,&local_138,0),
         local_e0.range <= 0.0)) {
        dVar7 = (pAVar9->__Pos).Z;
        if (pAVar9->Height + dVar7 <
            ((psVar17->floorplane).normal.Y * local_148.Y +
            (psVar17->floorplane).normal.X * local_148.X + (psVar17->floorplane).D) *
            (psVar17->floorplane).negiC) {
          return false;
        }
        return dVar7 <= (local_148.Y * (psVar17->ceilingplane).normal.Y +
                        local_148.X * (psVar17->ceilingplane).normal.X + (psVar17->ceilingplane).D)
                        * (psVar17->ceilingplane).negiC;
      }
      pFVar12 = FTextureManager::FindSwitch(&TexMan,(FTextureID)psVar2->textures[0].texture.texnum);
      if (pFVar12 == (FSwitchDef *)0x0) {
        pFVar12 = FTextureManager::FindSwitch
                            (&TexMan,(FTextureID)psVar2->textures[2].texture.texnum);
        if (pFVar12 == (FSwitchDef *)0x0) {
          if (((uVar8 >> 0x15 & 1) == 0) &&
             (pFVar12 = FTextureManager::FindSwitch
                                  (&TexMan,(FTextureID)psVar2->textures[1].texture.texnum),
             pFVar12 == (FSwitchDef *)0x0)) {
            dVar7 = (pAVar9->__Pos).Z;
            if (local_e0.top < pAVar9->Height + dVar7) {
              return true;
            }
            bVar10 = local_e0.bottom + -1.52587890625e-05 == dVar7;
            bVar18 = local_e0.bottom + -1.52587890625e-05 < dVar7;
          }
          else {
            bVar10 = P_GetMidTexturePosition(line,sideno,&local_e8,&local_f0);
            if (!bVar10) {
              return false;
            }
            dVar7 = (pAVar9->__Pos).Z;
            if (local_e8 + -1.52587890625e-05 <= dVar7) {
              return false;
            }
            dVar7 = dVar7 + pAVar9->Height;
            bVar10 = dVar7 == local_f0;
            bVar18 = dVar7 < local_f0;
          }
        }
        else {
          peVar3 = line->sidedef[1 - sideno]->sector->e;
          uVar13 = (ulong)(peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
          if (uVar13 != 0) {
            uVar16 = 0;
            do {
              pFVar6 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar16];
              if ((~pFVar6->flags & 0x40001) == 0) {
                pdVar5 = (double *)(pFVar6->top).plane;
                dVar7 = (pAVar9->__Pos).Z;
                if ((dVar7 <= (pdVar5[1] * local_148.Y + *pdVar5 * local_148.X + pdVar5[3]) *
                              pdVar5[4] + 1.52587890625e-05) &&
                   (pdVar5 = *(double **)&pFVar6->bottom,
                   (pdVar5[1] * local_148.Y + *pdVar5 * local_148.X + pdVar5[3]) * pdVar5[4] <=
                   dVar7 + pAVar9->Height)) {
                  return true;
                }
              }
              uVar16 = uVar16 + 1;
            } while (uVar13 != uVar16);
          }
          pdVar5 = &(pAVar9->__Pos).Z;
          bVar10 = local_e0.bottom == *pdVar5;
          bVar18 = local_e0.bottom < *pdVar5;
        }
      }
      else {
        peVar3 = line->sidedef[1 - sideno]->sector->e;
        uVar13 = (ulong)(peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
        if (uVar13 != 0) {
          lVar15 = 0;
          do {
            puVar4 = *(undefined8 **)
                      ((long)(peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array +
                      lVar15);
            if ((~*(uint *)(puVar4 + 0xb) & 0x20001) == 0) {
              pdVar5 = (double *)puVar4[5];
              dVar7 = (pAVar9->__Pos).Z;
              if ((dVar7 <= (pdVar5[1] * local_148.Y + *pdVar5 * local_148.X + pdVar5[3]) *
                            pdVar5[4] + 1.52587890625e-05) &&
                 (pdVar5 = (double *)*puVar4,
                 (pdVar5[1] * local_148.Y + *pdVar5 * local_148.X + pdVar5[3]) * pdVar5[4] <=
                 dVar7 + pAVar9->Height)) {
                return true;
              }
            }
            lVar15 = lVar15 + 8;
          } while (uVar13 << 3 != lVar15);
        }
        dVar7 = (pAVar9->__Pos).Z + pAVar9->Height;
        bVar10 = dVar7 == local_e0.top;
        bVar18 = dVar7 < local_e0.top;
      }
      return !bVar18 && !bVar10;
    }
  }
  return true;
}

Assistant:

bool P_CheckSwitchRange(AActor *user, line_t *line, int sideno, const DVector3 *optpos)
{
	// Activated from an empty side -> always succeed
	side_t *side = line->sidedef[sideno];
	if (side == NULL)
		return true;

	double checktop;
	double checkbot;
	sector_t *front = side->sector;
	FLineOpening open;
	int flags = line->flags;

	if (!side->GetTexture(side_t::mid).isValid())
	{ // Do not force range checks for 3DMIDTEX lines if there is no actual midtexture.
		flags &= ~ML_3DMIDTEX;
	}

	// 3DMIDTEX forces CHECKSWITCHRANGE because otherwise it might cause problems.
	if (!(flags & (ML_3DMIDTEX|ML_CHECKSWITCHRANGE)))
		return true;

	// calculate the point where the user would touch the wall.
	divline_t dll, dlu;
	double inter;
	DVector2 check;

	P_MakeDivline (line, &dll);

	DVector3 pos = optpos? *optpos : user->PosRelative(line);
	dlu.x = pos.X;
	dlu.y = pos.Y;
	dlu.dx = user->Angles.Yaw.Cos();
	dlu.dy = user->Angles.Yaw.Sin();
	inter = P_InterceptVector(&dll, &dlu);


	// Polyobjects must test the containing sector, not the one they originate from.
	if (line->sidedef[0]->Flags & WALLF_POLYOBJ)
	{
		// Get a check point slightly inside the polyobject so that this still works
		// if the polyobject lies directly on a sector boundary
		check.X = dll.x + dll.dx * (inter + 0.01);
		check.Y = dll.y + dll.dy * (inter + 0.01);
		front = P_PointInSector(check);
	}
	else
	{
		check.X = dll.x + dll.dx * inter;
		check.Y = dll.y + dll.dy * inter;
	}


	// one sided line or polyobject
	if (line->sidedef[1] == NULL || (line->sidedef[0]->Flags & WALLF_POLYOBJ))
	{
	onesided:
		double sectorc = front->ceilingplane.ZatPoint(check);
		double sectorf = front->floorplane.ZatPoint(check);
		return (user->Top() >= sectorf && user->Z() <= sectorc);
	}

	// Now get the information from the line.
	P_LineOpening(open, NULL, line, check, &pos);
	if (open.range <= 0)
		goto onesided;

	if ((TexMan.FindSwitch(side->GetTexture(side_t::top))) != NULL)
	{

		// Check 3D floors on back side
		{
			sector_t * back = line->sidedef[1 - sideno]->sector;
			for (auto rover : back->e->XFloor.ffloors)
			{
				if (!(rover->flags & FF_EXISTS)) continue;
				if (!(rover->flags & FF_UPPERTEXTURE)) continue;

				if (user->isAbove(rover->top.plane->ZatPoint(check)) ||
					user->Top() < rover->bottom.plane->ZatPoint(check))
					continue;

				// This 3D floor depicts a switch texture in front of the player's eyes
				return true;
			}
		}

		return (user->Top() > open.top);
	}
	else if ((TexMan.FindSwitch(side->GetTexture(side_t::bottom))) != NULL)
	{
		// Check 3D floors on back side
		{
			sector_t * back = line->sidedef[1 - sideno]->sector;
			for (unsigned i = 0; i < back->e->XFloor.ffloors.Size(); i++)
			{
				F3DFloor *rover = back->e->XFloor.ffloors[i];
				if (!(rover->flags & FF_EXISTS)) continue;
				if (!(rover->flags & FF_LOWERTEXTURE)) continue;

				if (user->isAbove(rover->top.plane->ZatPoint(check)) ||
					user->Top() < rover->bottom.plane->ZatPoint(check))
					continue;

				// This 3D floor depicts a switch texture in front of the player's eyes
				return true;
			}
		}

		return (user->Z() < open.bottom);
	}
	else if ((flags & ML_3DMIDTEX) || (TexMan.FindSwitch(side->GetTexture(side_t::mid))) != NULL)
	{
		// 3DMIDTEX lines will force a mid texture check if no switch is found on this line
		// to keep compatibility with Eternity's implementation.
		if (!P_GetMidTexturePosition(line, sideno, &checktop, &checkbot))
			return false;
		return user->isBelow(checktop) && user->Top() > checkbot;
	}
	else
	{
		// no switch found. Check whether the player can touch either top or bottom texture
		return (user->Top() > open.top) || (user->isBelow(open.bottom));
	}
}